

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::reportIfCannotBeNull
          (CheckerVisitor *this,Expr *checkee,Expr *n,char *loc)

{
  int iVar1;
  TreeOp TVar2;
  Expr *pEVar4;
  Expr *pEVar5;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  ulong uVar3;
  
  TVar2 = (checkee->super_Node)._op;
  if (TVar2 == TO_NULLC) {
    checkee = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,&local_34,false);
    TVar2 = (checkee->super_Node)._op;
  }
  uVar3 = (ulong)(TVar2 - TO_OR);
  if (0x2d < TVar2 - TO_OR) {
    return;
  }
  if ((0xf87c0dffffU >> (uVar3 & 0x3f) & 1) == 0) {
    if (uVar3 == 0x22) {
      iVar1 = *(int *)&(checkee->super_Node).field_0x1c;
    }
    else {
      if (uVar3 != 0x2d) {
        return;
      }
      pEVar4 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,&local_30,false);
      pEVar5 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates.lineEnd,&local_2c,false)
      ;
      uVar3 = (ulong)(pEVar4->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 != 0x39) {
          return;
        }
        if (*(int *)&(pEVar4->super_Node).field_0x1c == 4) {
          return;
        }
      }
      uVar3 = (ulong)(pEVar5->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0014f839;
      if (uVar3 != 0x39) {
        return;
      }
      iVar1 = *(int *)&(pEVar5->super_Node).field_0x1c;
    }
    if (iVar1 == 4) {
      return;
    }
  }
LAB_0014f839:
  report(this,&n->super_Node,0x7a,loc);
  return;
}

Assistant:

void CheckerVisitor::reportIfCannotBeNull(const Expr *checkee, const Expr *n, const char *loc) {
  assert(n);

  if (checkee->op() == TO_NULLC) {
    checkee = maybeEval(static_cast<const BinExpr *>(checkee)->rhs());
  }

  if (checkee->op() == TO_TERNARY) {
    const TerExpr *ter = static_cast<const TerExpr *>(checkee);
    const Expr *ifTrue = maybeEval(ter->b());
    const Expr *ifFalse = maybeEval(ter->c());

    if (cannotBeNull(ifTrue) && cannotBeNull(ifFalse)) {
      report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
    }
    return;
  }

  if (cannotBeNull(checkee))
    report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
}